

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall wasm::TranslateToFuzzReader::makeStringSlice(TranslateToFuzzReader *this)

{
  StringSliceWTF *pSVar1;
  Type local_40;
  Expression *local_38;
  Expression *end;
  Expression *local_28;
  Expression *start;
  Expression *local_18;
  Expression *ref;
  TranslateToFuzzReader *this_local;
  
  ref = (Expression *)this;
  HeapType::HeapType((HeapType *)&start,string);
  local_18 = makeTrappingRefUse(this,(HeapType)start);
  Type::Type((Type *)&end,i32);
  local_28 = make(this,(Type)end);
  Type::Type(&local_40,i32);
  local_38 = make(this,local_40);
  pSVar1 = Builder::makeStringSliceWTF(&this->builder,local_18,local_28,local_38);
  return (Expression *)pSVar1;
}

Assistant:

Expression* TranslateToFuzzReader::makeStringSlice() {
  auto* ref = makeTrappingRefUse(HeapType::string);
  auto* start = make(Type::i32);
  auto* end = make(Type::i32);
  return builder.makeStringSliceWTF(ref, start, end);
}